

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O1

void __thiscall
ByteCodeGenerator::TrackRegisterPropertyForDebugger
          (ByteCodeGenerator *this,DebuggerScope *debuggerScope,Symbol *symbol,FuncInfo *funcInfo,
          DebuggerScopePropertyFlags flags,bool isFunctionDeclaration)

{
  RegSlot location;
  code *pcVar1;
  bool bVar2;
  PropertyId propertyId;
  undefined4 *puVar3;
  FunctionBody *this_00;
  
  if (debuggerScope == (DebuggerScope *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x143,"(debuggerScope)","debuggerScope");
    if (!bVar2) goto LAB_00806d65;
    *puVar3 = 0;
  }
  if (symbol == (Symbol *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x144,"(symbol)","symbol");
    if (!bVar2) goto LAB_00806d65;
    *puVar3 = 0;
  }
  if (funcInfo == (FuncInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x145,"(funcInfo)","funcInfo");
    if (!bVar2) {
LAB_00806d65:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  location = symbol->location;
  if ((debuggerScope->scopeType != DiagCatchScopeDirect) &&
     (debuggerScope->scopeType != DiagBlockScopeDirect)) {
    debuggerScope =
         Js::DebuggerScope::GetSiblingScope(debuggerScope,location,(this->m_writer).m_functionWrite)
    ;
  }
  bVar2 = ShouldTrackDebuggerMetadata(this);
  if ((bVar2) && ((symbol->field_0x43 & 0x20) == 0)) {
    propertyId = Symbol::EnsurePosition(symbol,this);
    Js::ByteCodeWriter::AddPropertyToDebuggerScope
              (&this->m_writer,debuggerScope,location,propertyId,true,flags,isFunctionDeclaration);
    this_00 = FuncInfo::GetParsedFunctionBody(funcInfo);
    Js::FunctionBody::InsertSymbolToRegSlotList(this_00,location,propertyId,funcInfo->varRegsCount);
    symbol->field_0x43 = symbol->field_0x43 | 0x20;
  }
  return;
}

Assistant:

void ByteCodeGenerator::TrackRegisterPropertyForDebugger(
    Js::DebuggerScope *debuggerScope,
    Symbol *symbol,
    FuncInfo *funcInfo,
    Js::DebuggerScopePropertyFlags flags /*= Js::DebuggerScopePropertyFlags_None*/,
    bool isFunctionDeclaration /*= false*/)
{
    Assert(debuggerScope);
    Assert(symbol);
    Assert(funcInfo);

    Js::RegSlot location = symbol->GetLocation();

    Js::DebuggerScope *correctDebuggerScope = debuggerScope;
    if (debuggerScope->scopeType != Js::DiagExtraScopesType::DiagBlockScopeDirect && debuggerScope->scopeType != Js::DiagExtraScopesType::DiagCatchScopeDirect)
    {
        // We have to get the appropriate scope and add property over there.
        // Make sure the scope is created whether we're in debug mode or not, because we
        // need the empty scopes present during reparsing for debug mode.
        correctDebuggerScope = debuggerScope->GetSiblingScope(location, Writer()->GetFunctionWrite());
    }

    if (this->ShouldTrackDebuggerMetadata() && !symbol->GetIsTrackedForDebugger())
    {
        // Only track the property if we're in debug mode since it's only needed by the debugger.
        Js::PropertyId propertyId = symbol->EnsurePosition(this);

        this->Writer()->AddPropertyToDebuggerScope(
            correctDebuggerScope,
            location,
            propertyId,
            /*shouldConsumeRegister*/ true,
            flags,
            isFunctionDeclaration);

        Js::FunctionBody *byteCodeFunction = funcInfo->GetParsedFunctionBody();
        byteCodeFunction->InsertSymbolToRegSlotList(location, propertyId, funcInfo->varRegsCount);

        symbol->SetIsTrackedForDebugger(true);
    }
}